

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory64Lowering.cpp
# Opt level: O0

void __thiscall
wasm::Memory64Lowering::extendAddress64
          (Memory64Lowering *this,Expression **ptr,Name memoryOrTableName,bool isTable)

{
  Name name;
  Name name_00;
  bool bVar1;
  Table *this_00;
  Memory *this_01;
  Unary *pUVar2;
  Builder local_78;
  Type local_70;
  BasicType local_64;
  Memory64Lowering *local_60;
  size_t local_58;
  Memory64Lowering *local_50;
  size_t local_48;
  bool local_39;
  Module *pMStack_38;
  bool is64;
  Module *module;
  Expression **ppEStack_28;
  bool isTable_local;
  Expression **ptr_local;
  Memory64Lowering *this_local;
  Name memoryOrTableName_local;
  
  memoryOrTableName_local.super_IString.str._M_len = memoryOrTableName.super_IString.str._M_str;
  this_local = memoryOrTableName.super_IString.str._M_len;
  module._0_4_ = 1;
  module._7_1_ = isTable;
  ppEStack_28 = ptr;
  ptr_local = (Expression **)this;
  bVar1 = wasm::Type::operator==(&(*ptr)->type,(BasicType *)&module);
  if (!bVar1) {
    pMStack_38 = Walker<wasm::Memory64Lowering,_wasm::Visitor<wasm::Memory64Lowering,_void>_>::
                 getModule(&(this->
                            super_WalkerPass<wasm::PostWalker<wasm::Memory64Lowering,_wasm::Visitor<wasm::Memory64Lowering,_void>_>_>
                            ).
                            super_PostWalker<wasm::Memory64Lowering,_wasm::Visitor<wasm::Memory64Lowering,_void>_>
                            .
                            super_Walker<wasm::Memory64Lowering,_wasm::Visitor<wasm::Memory64Lowering,_void>_>
                          );
    local_39 = false;
    if ((module._7_1_ & 1) == 0) {
      local_60 = this_local;
      local_58 = memoryOrTableName_local.super_IString.str._M_len;
      name.super_IString.str._M_str = (char *)memoryOrTableName_local.super_IString.str._M_len;
      name.super_IString.str._M_len = (size_t)this_local;
      this_01 = Module::getMemory(pMStack_38,name);
      local_39 = Memory::is64(this_01);
    }
    else {
      local_50 = this_local;
      local_48 = memoryOrTableName_local.super_IString.str._M_len;
      name_00.super_IString.str._M_str = (char *)memoryOrTableName_local.super_IString.str._M_len;
      name_00.super_IString.str._M_len = (size_t)this_local;
      this_00 = Module::getTable(pMStack_38,name_00);
      local_39 = Table::is64(this_00);
    }
    if (local_39 != false) {
      local_64 = i64;
      bVar1 = wasm::Type::operator==(&(*ppEStack_28)->type,&local_64);
      if (!bVar1) {
        __assert_fail("ptr->type == Type::i64",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Memory64Lowering.cpp"
                      ,0x48,
                      "void wasm::Memory64Lowering::extendAddress64(Expression *&, Name, bool)");
      }
      wasm::Type::Type(&local_70,i32);
      ((*ppEStack_28)->type).id = local_70.id;
      Builder::Builder(&local_78,pMStack_38);
      pUVar2 = Builder::makeUnary(&local_78,ExtendUInt32,*ppEStack_28);
      *ppEStack_28 = (Expression *)pUVar2;
    }
  }
  return;
}

Assistant:

void extendAddress64(Expression*& ptr,
                       Name memoryOrTableName,
                       bool isTable = false) {
    if (ptr->type == Type::unreachable) {
      return;
    }
    auto& module = *getModule();
    bool is64 = false;
    if (isTable) {
      is64 = module.getTable(memoryOrTableName)->is64();
    } else {
      is64 = module.getMemory(memoryOrTableName)->is64();
    }
    if (is64) {
      assert(ptr->type == Type::i64);
      ptr->type = Type::i32;
      ptr = Builder(module).makeUnary(UnaryOp::ExtendUInt32, ptr);
    }
  }